

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O3

void anon_unknown.dwarf_ae217::ColorSwatchTextRegBits<>
               (Emulator *e,u8 v,PaletteRGBA pal_rgba,int color_index)

{
  ImU32 col;
  ImDrawList *this;
  undefined7 in_register_00000031;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 p;
  ImVec2 local_60;
  float local_58;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 local_38 [24];
  ImVec2 local_20;
  
  local_48 = CONCAT71(in_register_00000031,v);
  local_40 = pal_rgba.color._0_8_;
  ImGui::SameLine(0.0,-1.0);
  ImGui::Text("%d:",(ulong)pal_rgba.color[2]);
  col = *(ImU32 *)((long)&local_48 +
                  (ulong)((uint)e >> ((char)pal_rgba.color[2] * '\x02' & 0x1fU) & 3) * 4);
  local_58 = ImGui::GetTextLineHeight();
  ImGui::SameLine(0.0,-1.0);
  local_20 = ImGui::GetCursorScreenPos();
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_4_ = local_20.x;
  local_38._4_4_ = local_20.y;
  local_38._12_4_ = extraout_XMM0_Dd;
  this = ImGui::GetWindowDrawList();
  local_60.y = local_58 + (float)local_38._4_4_;
  local_60.x = local_58 + (float)local_38._0_4_;
  ImDrawList::AddRectFilled(this,&local_20,&local_60,col,0.0,0);
  local_60.y = local_58;
  local_60.x = local_58;
  ImGui::Dummy(&local_60);
  return;
}

Assistant:

void ColorSwatchTextRegBits(Emulator* e, u8 v, PaletteRGBA pal_rgba,
                            int color_index, Args... args) {
  ImGui::SameLine();
  ImGui::Text("%d:", color_index);
  u8 color = (v >> (color_index * 2)) & 3;
  RGBA color_rgba = pal_rgba.color[color];
  float sz = ImGui::GetTextLineHeight();
  ImGui::SameLine();
  ImVec2 p = ImGui::GetCursorScreenPos();
  ImGui::GetWindowDrawList()->AddRectFilled(p, ImVec2(p.x + sz, p.y + sz),
                                            color_rgba);
  ImGui::Dummy(ImVec2(sz, sz));
  TextRegBits(e, v, args...);
}